

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O1

void __thiscall b_tree_node::b_tree_node(b_tree_node *this,pager *p,uint16_t min_degree,bool leaf)

{
  uint16_t *puVar1;
  uint64_t ofs;
  runtime_error *this_00;
  long lVar2;
  
  this->_p = p;
  ofs = pager::append_page(p);
  this->_ofs_field = ofs;
  pager::map_page_from(&this->_mm,this->_p,ofs);
  this->_valid_keys_field = (uint8_t *)0x0;
  this->_vals_field = (int64_t *)0x0;
  this->_num_keys_field = (uint16_t *)0x0;
  this->_keys_field = (int64_t *)0x0;
  this->_min_degree_field = (uint16_t *)0x0;
  this->_leaf_field = (uint16_t *)0x0;
  this->_child_ofs_field = (int64_t *)0x0;
  puVar1 = (uint16_t *)(this->_mm)._mem;
  if (puVar1 != (uint16_t *)0x0) {
    this->_min_degree_field = puVar1;
    *puVar1 = min_degree;
    this->_leaf_field = puVar1 + 1;
    puVar1[1] = (ushort)leaf;
    this->_num_keys_field = puVar1 + 2;
    puVar1[2] = 0;
    this->_keys_field = (int64_t *)(puVar1 + 3);
    lVar2 = (ulong)min_degree * 0x10;
    this->_valid_keys_field = (uint8_t *)(puVar1 + (ulong)min_degree * 8 + -1);
    this->_vals_field = (int64_t *)((long)puVar1 + (ulong)min_degree * 2 + lVar2 + -3);
    this->_child_ofs_field =
         (int64_t *)
         ((long)(puVar1 + (ulong)min_degree * 8 + -1) + lVar2 + (ulong)min_degree * 2 + -9);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unable to map default constructed memory map.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

b_tree_node::b_tree_node(const pager& p, uint16_t min_degree, bool leaf) :
    _p(p),
    _ofs_field(_p.append_page()),
    _mm(_p.map_page_from(_ofs_field)),
    _min_degree_field(nullptr),
    _leaf_field(nullptr),
    _num_keys_field(nullptr),
    _keys_field(nullptr),
    _valid_keys_field(nullptr),
    _vals_field(nullptr),
    _child_ofs_field(nullptr)
{
    auto read_ptr = _mm.map().first;

    _min_degree_field = (uint16_t*)read_ptr;
    *(_min_degree_field) = min_degree;
    read_ptr += sizeof(uint16_t);

    _leaf_field = (uint16_t*)read_ptr;
    *(_leaf_field) = leaf ? 1 : 0;
    read_ptr += sizeof(uint16_t);

    _num_keys_field = (uint16_t*)read_ptr;
    *(_num_keys_field) = 0;
    read_ptr += sizeof(uint16_t);

    _keys_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _valid_keys_field = (uint8_t*)read_ptr;
    read_ptr += sizeof(uint8_t) * ((*_min_degree_field * 2) - 1);

    _vals_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _child_ofs_field = (int64_t*)read_ptr;
}